

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void Fill_SSE2(uint8_t *dst,int value,int size)

{
  long lVar1;
  
  if (size == 8) {
    Put8x8uv_SSE2((uint8_t)value,dst);
    return;
  }
  if (size == 4) {
    for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
      *(uint *)(dst + lVar1) = (value & 0xffU) * 0x1010101;
    }
    return;
  }
  Put16_SSE2((uint8_t)value,dst);
  return;
}

Assistant:

static WEBP_INLINE void Fill_SSE2(uint8_t* dst, int value, int size) {
  if (size == 4) {
    int j;
    for (j = 0; j < 4; ++j) {
      memset(dst + j * BPS, value, 4);
    }
  } else if (size == 8) {
    Put8x8uv_SSE2(value, dst);
  } else {
    Put16_SSE2(value, dst);
  }
}